

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void block(LexState *ls)

{
  long in_RDI;
  BlockCnt bl;
  FuncState *fs;
  FuncState *in_stack_ffffffffffffffe0;
  
  enterblock(*(FuncState **)(in_RDI + 0x30),(BlockCnt *)&stack0xffffffffffffffe0,'\0');
  chunk((LexState *)in_stack_ffffffffffffffe0);
  leaveblock(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

static void block(LexState*ls){
FuncState*fs=ls->fs;
BlockCnt bl;
enterblock(fs,&bl,0);
chunk(ls);
leaveblock(fs);
}